

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void setup_used_hard_regs(gen_ctx_t gen_ctx,MIR_type_t type,MIR_reg_t hard_reg)

{
  int iVar1;
  MIR_reg_t MVar2;
  int local_20;
  int slots_num;
  int i;
  MIR_reg_t curr_hard_reg;
  MIR_reg_t hard_reg_local;
  MIR_type_t type_local;
  gen_ctx_t gen_ctx_local;
  
  iVar1 = target_locs_num(hard_reg,type);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    MVar2 = target_nth_loc(hard_reg,type,local_20);
    if (MVar2 < 0x22) {
      bitmap_set_bit_p(gen_ctx->func_used_hard_regs,(ulong)MVar2);
    }
  }
  return;
}

Assistant:

static void setup_used_hard_regs (gen_ctx_t gen_ctx, MIR_type_t type, MIR_reg_t hard_reg) {
  MIR_reg_t curr_hard_reg;
  int i, slots_num = target_locs_num (hard_reg, type);

  for (i = 0; i < slots_num; i++)
    if ((curr_hard_reg = target_nth_loc (hard_reg, type, i)) <= MAX_HARD_REG)
      bitmap_set_bit_p (func_used_hard_regs, curr_hard_reg);
}